

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ConvexCornerOption __thiscall
ON_SubDFromMeshParameters::GetConvexCornerOption(ON_SubDFromMeshParameters *this)

{
  ConvexCornerOption CVar1;
  
  CVar1 = this->m_convex_corner_option;
  if ((None < CVar1) &&
     ((((CVar1 != AtMeshCorner || (0xffee < (ushort)(this->m_maximum_convex_corner_edge_count - 2)))
       || (this->m_maximum_convex_corner_angle_radians < 0.0)) ||
      (CVar1 = AtMeshCorner, 3.141592653589793 <= this->m_maximum_convex_corner_angle_radians)))) {
    return Unset;
  }
  return CVar1;
}

Assistant:

ON_SubDFromMeshParameters::ConvexCornerOption ON_SubDFromMeshParameters::GetConvexCornerOption() const
{
  switch (m_convex_corner_option)
  {
  case ON_SubDFromMeshParameters::ConvexCornerOption::Unset:
  case ON_SubDFromMeshParameters::ConvexCornerOption::None:
    return m_convex_corner_option;

  case ON_SubDFromMeshParameters::ConvexCornerOption::AtMeshCorner:
    if ( m_maximum_convex_corner_edge_count >= 2 
         && m_maximum_convex_corner_edge_count <= ON_SubDVertex::MaximumEdgeCount
         && m_maximum_convex_corner_angle_radians >= 0.0
         && m_maximum_convex_corner_angle_radians < ON_PI
         )
         return m_convex_corner_option;
    break;
  }

  return ON_SubDFromMeshParameters::ConvexCornerOption::Unset;
}